

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.h
# Opt level: O1

void __thiscall bloaty::Options::add_data_source(Options *this,string *value)

{
  int iVar1;
  Rep *pRVar2;
  Arena *this_00;
  string *psVar3;
  
  pRVar2 = (this->data_source_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00184c5e:
    google::protobuf::internal::RepeatedPtrFieldBase::Reserve
              (&(this->data_source_).super_RepeatedPtrFieldBase,
               (this->data_source_).super_RepeatedPtrFieldBase.total_size_ + 1);
  }
  else {
    iVar1 = (this->data_source_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (this->data_source_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      psVar3 = (string *)pRVar2->elements[iVar1];
      goto LAB_00184ccd;
    }
    if (pRVar2->allocated_size == (this->data_source_).super_RepeatedPtrFieldBase.total_size_)
    goto LAB_00184c5e;
  }
  pRVar2 = (this->data_source_).super_RepeatedPtrFieldBase.rep_;
  pRVar2->allocated_size = pRVar2->allocated_size + 1;
  this_00 = (this->data_source_).super_RepeatedPtrFieldBase.arena_;
  if (this_00 == (Arena *)0x0) {
    psVar3 = (string *)operator_new(0x20);
  }
  else {
    if (this_00->hooks_cookie_ != (void *)0x0) {
      google::protobuf::Arena::OnArenaAllocation
                (this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    }
    psVar3 = (string *)
             google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                       (&this_00->impl_,0x20,
                        google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
  }
  *(string **)psVar3 = psVar3 + 0x10;
  *(long *)(psVar3 + 8) = 0;
  psVar3[0x10] = (string)0x0;
  pRVar2 = (this->data_source_).super_RepeatedPtrFieldBase.rep_;
  iVar1 = (this->data_source_).super_RepeatedPtrFieldBase.current_size_;
  (this->data_source_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
  pRVar2->elements[iVar1] = psVar3;
LAB_00184ccd:
  std::__cxx11::string::_M_assign(psVar3);
  return;
}

Assistant:

inline void Options::add_data_source(const std::string& value) {
  data_source_.Add()->assign(value);
  // @@protoc_insertion_point(field_add:bloaty.Options.data_source)
}